

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

void __thiscall
vkt::synchronization::anon_unknown_0::ShaderAccess::BufferSupport::initPrograms
          (BufferSupport *this,SourceCollections *programCollection)

{
  ostream *poVar1;
  int iVar2;
  char *pcVar3;
  bool bVar4;
  string bufferTypeStr;
  ostringstream copySrc;
  ostringstream declSrc;
  long *local_378;
  long local_370;
  long local_368 [2];
  string local_358;
  string local_338;
  ostringstream local_318 [112];
  ios_base local_2a8 [264];
  ostringstream local_1a0 [112];
  ios_base local_130 [264];
  
  bVar4 = this->m_bufferType == BUFFER_TYPE_UNIFORM;
  pcVar3 = "buffer";
  if (bVar4) {
    pcVar3 = "uniform";
  }
  local_378 = local_368;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_378,pcVar3,pcVar3 + (ulong)bVar4 + 6);
  iVar2 = (this->m_resourceDesc).size.m_data[0];
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"layout(set = 0, binding = 0, std140) readonly ",0x2e);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(char *)local_378,local_370);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," Input {\n",9);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uvec4 data[",0xf);
  iVar2 = iVar2 >> 4;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} b_in;\n",8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"layout(set = 0, binding = 1, std140) writeonly buffer Output {\n",0x3f);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    uvec4 data[",0xf);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"];\n",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"} b_out;\n",9);
  std::__cxx11::ostringstream::ostringstream(local_318);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_318,"    for (int i = 0; i < ",0x18);
  poVar1 = (ostream *)std::ostream::operator<<(local_318,iVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"; ++i) {\n",9);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"        b_out.data[i] = b_in.data[i];\n",0x26);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"    }\n",6);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringbuf::str();
  initPassthroughPrograms
            (programCollection,&this->m_shaderPrefix,&local_338,&local_358,this->m_stage);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_338._M_dataplus._M_p != &local_338.field_2) {
    operator_delete(local_338._M_dataplus._M_p,local_338.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_318);
  std::ios_base::~ios_base(local_2a8);
  std::__cxx11::ostringstream::~ostringstream(local_1a0);
  std::ios_base::~ios_base(local_130);
  if (local_378 != local_368) {
    operator_delete(local_378,local_368[0] + 1);
  }
  return;
}

Assistant:

void initPrograms (SourceCollections& programCollection) const
	{
		DE_ASSERT((m_resourceDesc.size.x() % sizeof(tcu::UVec4)) == 0);

		const std::string	bufferTypeStr	= (m_bufferType == BUFFER_TYPE_UNIFORM ? "uniform" : "buffer");
		const int			numVecElements	= static_cast<int>(m_resourceDesc.size.x() / sizeof(tcu::UVec4));  // std140 must be aligned to a multiple of 16

		std::ostringstream declSrc;
		declSrc << "layout(set = 0, binding = 0, std140) readonly " << bufferTypeStr << " Input {\n"
				<< "    uvec4 data[" << numVecElements << "];\n"
				<< "} b_in;\n"
				<< "\n"
				<< "layout(set = 0, binding = 1, std140) writeonly buffer Output {\n"
				<< "    uvec4 data[" << numVecElements << "];\n"
				<< "} b_out;\n";

		std::ostringstream copySrc;
		copySrc << "    for (int i = 0; i < " << numVecElements << "; ++i) {\n"
				<< "        b_out.data[i] = b_in.data[i];\n"
				<< "    }\n";

		initPassthroughPrograms(programCollection, m_shaderPrefix, declSrc.str(), copySrc.str(), m_stage);
	}